

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

void stack_5_3::test_stack(void)

{
  linklist_5_3::create((int *)&DAT_00104140,3,5);
  return;
}

Assistant:

void test() {
        linklist_5_3::LinkList list;
        int aa[] = {1, 2, 3, 2, 1};
        list = linklist_5_3::create(aa, 3, 5);
        linklist_5_3::LinkList a = (linklist_5_3::LinkList) malloc(sizeof(linklist_5_3::node));
        a->next = list;
        semmetry(a, 5);

    }